

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O3

apx_error_t
apx_clientSocketConnection_create(apx_clientSocketConnection_t *self,msocket_t *socket_object)

{
  apx_error_t aVar1;
  apx_connectionBaseVTable_t base_connection_vtable;
  apx_connectionInterface_t connection_interface;
  msocket_handler_t local_c8;
  apx_connectionBaseVTable_t local_98;
  apx_connectionInterface_t local_68;
  
  if (self == (apx_clientSocketConnection_t *)0x0) {
    aVar1 = 1;
  }
  else {
    pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
    self->default_buffer_size = 0x1000;
    self->pending_bytes = 0;
    apx_connectionBaseVTable_create
              (&local_98,apx_clientSocketConnection_vdestroy,apx_clientSocketConnection_vstart,
               apx_clientSocketConnection_vclose);
    local_68.remote_file_published_notification = (_func_apx_error_t_void_ptr_apx_file_t_ptr *)0x0;
    local_68.remote_file_write_notification =
         (_func_apx_error_t_void_ptr_apx_file_t_ptr_uint32_t_uint8_t_ptr_apx_size_t *)0x0;
    local_68.transmit_max_buffer_size = apx_clientSocketConnection_vtransmit_max_bytes_avaiable;
    local_68.transmit_current_bytes_avaiable =
         apx_clientSocketConnection_vtransmit_current_bytes_avaiable;
    local_68.transmit_begin = apx_clientSocketConnection_vtransmit_begin;
    local_68.transmit_end = apx_clientSocketConnection_vtransmit_end;
    local_68.transmit_data_message = apx_clientSocketConnection_vtransmit_data_message;
    local_68.transmit_direct_message = apx_clientSocketConnection_vtransmit_direct_message;
    local_68.arg = self;
    aVar1 = apx_clientConnection_create(&self->base,&local_98,&local_68);
    if (aVar1 == 0) {
      adt_bytearray_create(&self->send_buffer,0x1000);
      if (socket_object != (msocket_t *)0x0) {
        local_c8.tcp_inactivity = (_func_void_uint32_t *)0x0;
        local_c8.tcp_accept = (_func_void_void_ptr_msocket_server_tag_ptr_msocket_t_ptr *)0x0;
        local_c8.udp_msg = (_func_void_void_ptr_char_ptr_uint16_t_uint8_t_ptr_uint32_t *)0x0;
        local_c8.tcp_connected = on_socket_connected;
        local_c8.tcp_data = on_socket_data;
        local_c8.tcp_disconnected = on_socket_disconnected;
        msocket_set_handler(socket_object,&local_c8,self);
        self->socket_object = socket_object;
      }
      apx_connectionBase_start((apx_connectionBase_t *)self);
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_clientSocketConnection_create(apx_clientSocketConnection_t *self, SOCKET_TYPE * socket_object)
{
   if (self != 0)
   {
      apx_connectionBaseVTable_t base_connection_vtable;
      apx_connectionInterface_t connection_interface;
      MUTEX_INIT(self->lock);
      self->default_buffer_size = SEND_BUFFER_GROW_SIZE;
      self->pending_bytes = 0u;
      apx_connectionBaseVTable_create(&base_connection_vtable,
            apx_clientSocketConnection_vdestroy,
            apx_clientSocketConnection_vstart,
            apx_clientSocketConnection_vclose);
      create_connection_interface_vtable(self, &connection_interface);
      apx_error_t result = apx_clientConnection_create(&self->base, &base_connection_vtable, &connection_interface);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      adt_bytearray_create(&self->send_buffer, SEND_BUFFER_GROW_SIZE);
      register_msocket_handler(self, socket_object);
      apx_connectionBase_start(&self->base.base);///TODO: Don't call start from the constructor
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}